

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_duplicate_file_descriptor_to_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  int err;
  int local_58;
  int local_48;
  sexp_conflict local_40;
  sexp_conflict local_8;
  
  if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)) {
    if (((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0x12)) || (((ulong)in_R8 & 1) == 1)) {
      if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
        local_48 = (int)*(undefined8 *)(in_RCX + 4);
      }
      else {
        auVar1._8_8_ = (long)in_RCX >> 0x3f;
        auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
        local_48 = SUB164(auVar1 / SEXT816(2),0);
      }
      if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0x12)) {
        local_58 = (int)*(undefined8 *)(in_R8 + 4);
      }
      else {
        auVar2._8_8_ = (long)in_R8 >> 0x3f;
        auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_58 = SUB164(auVar2 / SEXT816(2),0);
      }
      iVar3 = dup2(local_48,local_58);
      if (iVar3 == 0) {
        local_40 = (sexp_conflict)0x13e;
      }
      else {
        local_40 = (sexp_conflict)0x3e;
      }
      local_8 = local_40;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x12,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x12,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_duplicate_file_descriptor_to_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  if (! (sexp_filenop(arg1) || sexp_fixnump(arg1)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg1);
  err = dup2((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), (sexp_filenop(arg1) ? sexp_fileno_fd(arg1) : sexp_unbox_fixnum(arg1)));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}